

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  bool bVar1;
  SnapPromiseAllResolveElementFunctionInfo *capabilityInfo;
  ScriptContext *ctx_00;
  JavascriptPromiseCapability *capabilities_00;
  JavascriptLibrary *pJVar2;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *pJVar3;
  RecyclableObject *pRVar4;
  RecyclableObject *values;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *wrapper;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingWrapper;
  JavascriptPromiseCapability *capabilities;
  ScriptContext *ctx;
  SnapPromiseAllResolveElementFunctionInfo *aInfo;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  capabilityInfo =
       SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)31>
                 (snpObject);
  ctx_00 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  capabilities_00 =
       NSSnapValues::InflatePromiseCapabilityInfo(&capabilityInfo->Capabilities,ctx_00,inflator);
  bVar1 = InflateMap::
          IsPromiseInfoDefined<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
                    (inflator,capabilityInfo->RemainingElementsWrapperId);
  if (!bVar1) {
    pJVar2 = Js::ScriptContext::GetLibrary(ctx_00);
    pJVar3 = Js::JavascriptLibrary::CreateRemainingElementsWrapper_TTD
                       (pJVar2,ctx_00,capabilityInfo->RemainingElementsValue);
    InflateMap::
    AddInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
              (inflator,capabilityInfo->RemainingElementsWrapperId,pJVar3);
  }
  pJVar3 = InflateMap::
           LookupInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
                     (inflator,capabilityInfo->RemainingElementsWrapperId);
  pRVar4 = InflateMap::LookupObject(inflator,capabilityInfo->Values);
  pJVar2 = Js::ScriptContext::GetLibrary(ctx_00);
  pRVar4 = Js::JavascriptLibrary::CreatePromiseAllResolveElementFunction_TTD
                     (pJVar2,capabilities_00,capabilityInfo->Index,pJVar3,pRVar4,
                      (bool)(capabilityInfo->AlreadyCalled & 1));
  return pRVar4;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            const SnapPromiseAllResolveElementFunctionInfo* aInfo = SnapObjectGetAddtlInfoAs<SnapPromiseAllResolveElementFunctionInfo*, SnapObjectType::SnapPromiseAllResolveElementFunctionObject>(snpObject);
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::JavascriptPromiseCapability* capabilities = InflatePromiseCapabilityInfo(&aInfo->Capabilities, ctx, inflator);

            if (!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>(aInfo->RemainingElementsWrapperId))
            {
                Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingWrapper = ctx->GetLibrary()->CreateRemainingElementsWrapper_TTD(ctx, aInfo->RemainingElementsValue);
                inflator->AddInflatedPromiseInfo(aInfo->RemainingElementsWrapperId, remainingWrapper);
            }
            Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* wrapper = inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>(aInfo->RemainingElementsWrapperId);

            Js::RecyclableObject* values = inflator->LookupObject(aInfo->Values);

            return ctx->GetLibrary()->CreatePromiseAllResolveElementFunction_TTD(capabilities, aInfo->Index, wrapper, values, aInfo->AlreadyCalled);
        }